

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx2_adder_forest(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [32];
  undefined1 (*pauVar5) [32];
  undefined1 (*pauVar6) [32];
  undefined1 (*pauVar7) [32];
  undefined1 (*pauVar8) [32];
  undefined1 (*pauVar9) [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 (*pauVar12) [32];
  uint uVar13;
  ulong uVar14;
  uint16_t *puVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 in_ZMM17 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 in_ZMM18 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 in_ZMM19 [64];
  undefined1 auVar67 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar68 [16];
  undefined1 in_ZMM29 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 in_ZMM30 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 in_ZMM31 [64];
  undefined1 auVar73 [64];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_280 [40];
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  auVar72 = in_ZMM31._0_16_;
  auVar70 = in_ZMM30._0_16_;
  auVar68 = in_ZMM29._0_16_;
  auVar66 = in_ZMM19._0_16_;
  auVar64 = in_ZMM18._0_16_;
  auVar62 = in_ZMM17._0_16_;
  auVar17 = in_ZMM16._0_16_;
  auVar48 = ZEXT1664((undefined1  [16])0x0);
  uVar13 = len >> 8;
  local_c0 = vmovdqa64_avx512f(auVar48);
  local_100 = vmovdqa64_avx512f(auVar48);
  local_140 = vmovdqa64_avx512f(auVar48);
  local_180 = vmovdqa64_avx512f(auVar48);
  local_1c0 = vmovdqa64_avx512f(auVar48);
  local_200 = vmovdqa64_avx512f(auVar48);
  local_240 = vmovdqa64_avx512f(auVar48);
  _local_280 = vmovdqa64_avx512f(auVar48);
  if (len < 0x100000) {
    uVar14 = 0;
  }
  else {
    auVar46[8] = 0x55;
    auVar46._0_8_ = 0x5555555555555555;
    auVar46[9] = 0x55;
    auVar46[10] = 0x55;
    auVar46[0xb] = 0x55;
    auVar46[0xc] = 0x55;
    auVar46[0xd] = 0x55;
    auVar46[0xe] = 0x55;
    auVar46[0xf] = 0x55;
    auVar46[0x10] = 0x55;
    auVar46[0x11] = 0x55;
    auVar46[0x12] = 0x55;
    auVar46[0x13] = 0x55;
    auVar46[0x14] = 0x55;
    auVar46[0x15] = 0x55;
    auVar46[0x16] = 0x55;
    auVar46[0x17] = 0x55;
    auVar46[0x18] = 0x55;
    auVar46[0x19] = 0x55;
    auVar46[0x1a] = 0x55;
    auVar46[0x1b] = 0x55;
    auVar46[0x1c] = 0x55;
    auVar46[0x1d] = 0x55;
    auVar46[0x1e] = 0x55;
    auVar46[0x1f] = 0x55;
    auVar50[8] = 0x33;
    auVar50._0_8_ = 0x3333333333333333;
    auVar50[9] = 0x33;
    auVar50[10] = 0x33;
    auVar50[0xb] = 0x33;
    auVar50[0xc] = 0x33;
    auVar50[0xd] = 0x33;
    auVar50[0xe] = 0x33;
    auVar50[0xf] = 0x33;
    auVar50[0x10] = 0x33;
    auVar50[0x11] = 0x33;
    auVar50[0x12] = 0x33;
    auVar50[0x13] = 0x33;
    auVar50[0x14] = 0x33;
    auVar50[0x15] = 0x33;
    auVar50[0x16] = 0x33;
    auVar50[0x17] = 0x33;
    auVar50[0x18] = 0x33;
    auVar50[0x19] = 0x33;
    auVar50[0x1a] = 0x33;
    auVar50[0x1b] = 0x33;
    auVar50[0x1c] = 0x33;
    auVar50[0x1d] = 0x33;
    auVar50[0x1e] = 0x33;
    auVar50[0x1f] = 0x33;
    auVar51[8] = 7;
    auVar51._0_8_ = 0x707070707070707;
    auVar51[9] = 7;
    auVar51[10] = 7;
    auVar51[0xb] = 7;
    auVar51[0xc] = 7;
    auVar51[0xd] = 7;
    auVar51[0xe] = 7;
    auVar51[0xf] = 7;
    auVar51[0x10] = 7;
    auVar51[0x11] = 7;
    auVar51[0x12] = 7;
    auVar51[0x13] = 7;
    auVar51[0x14] = 7;
    auVar51[0x15] = 7;
    auVar51[0x16] = 7;
    auVar51[0x17] = 7;
    auVar51[0x18] = 7;
    auVar51[0x19] = 7;
    auVar51[0x1a] = 7;
    auVar51[0x1b] = 7;
    auVar51[0x1c] = 7;
    auVar51[0x1d] = 7;
    auVar51[0x1e] = 7;
    auVar51[0x1f] = 7;
    auVar43._8_2_ = 0xf;
    auVar43._0_8_ = 0xf000f000f000f;
    auVar43._10_2_ = 0xf;
    auVar43._12_2_ = 0xf;
    auVar43._14_2_ = 0xf;
    auVar43._16_2_ = 0xf;
    auVar43._18_2_ = 0xf;
    auVar43._20_2_ = 0xf;
    auVar43._22_2_ = 0xf;
    auVar43._24_2_ = 0xf;
    auVar43._26_2_ = 0xf;
    auVar43._28_2_ = 0xf;
    auVar43._30_2_ = 0xf;
    puVar15 = array + 0xf0;
    uVar14 = 0;
    do {
      auVar59 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar60 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar61 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar17 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
      in_ZMM16 = ZEXT1664(auVar17);
      auVar17 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
      in_ZMM17 = ZEXT1664(auVar17);
      auVar17 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
      in_ZMM18 = ZEXT1664(auVar17);
      auVar17 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
      in_ZMM19 = ZEXT1664(auVar17);
      auVar17 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
      in_ZMM20 = ZEXT1664(auVar17);
      auVar17 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
      in_ZMM21 = ZEXT1664(auVar17);
      auVar17 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
      in_ZMM22 = ZEXT1664(auVar17);
      auVar17 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
      in_ZMM23 = ZEXT1664(auVar17);
      auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar57 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar48 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
      local_460._0_8_ = 0;
      local_460._8_8_ = 0;
      local_460._16_8_ = 0;
      local_460._24_8_ = 0;
      lVar16 = 0;
      do {
        auVar18 = *(undefined1 (*) [32])((long)puVar15 + lVar16 + -0x1e0);
        auVar19 = *(undefined1 (*) [32])((long)puVar15 + lVar16 + -0x1c0);
        auVar53 = *(undefined1 (*) [32])((long)puVar15 + lVar16 + -0x1a0);
        auVar45 = *(undefined1 (*) [32])((long)puVar15 + lVar16 + -0x180);
        auVar54 = *(undefined1 (*) [32])((long)puVar15 + lVar16 + -0x160);
        auVar34 = *(undefined1 (*) [32])((long)puVar15 + lVar16 + -0x140);
        auVar32 = *(undefined1 (*) [32])((long)puVar15 + lVar16 + -0x120);
        auVar47 = *(undefined1 (*) [32])((long)puVar15 + lVar16 + -0x100);
        auVar38 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar15 + lVar16 + -0xe0));
        auVar42 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar15 + lVar16 + -0xc0));
        auVar20 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar15 + lVar16 + -0xa0));
        auVar55 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar15 + lVar16 + -0x80));
        auVar39 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar15 + lVar16 + -0x60));
        auVar21 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar15 + lVar16 + -0x40));
        auVar22 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar15 + lVar16 + -0x20));
        auVar23 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar15 + lVar16));
        lVar16 = lVar16 + 0x200;
        auVar49 = vpand_avx2(auVar18,auVar46);
        auVar44 = vpand_avx2(auVar19,auVar46);
        auVar25 = vpsrlw_avx2(auVar18,1);
        auVar26 = vpsrlw_avx2(auVar19,1);
        auVar24 = vpaddb_avx512vl(auVar44,auVar49);
        auVar18 = vpand_avx2(auVar53,auVar46);
        auVar19 = vpand_avx2(auVar45,auVar46);
        auVar49 = vpand_avx2(auVar25,auVar46);
        auVar44 = vpand_avx2(auVar26,auVar46);
        auVar25 = vpaddb_avx512vl(auVar19,auVar18);
        auVar18 = vpand_avx2(auVar54,auVar46);
        auVar19 = vpand_avx2(auVar34,auVar46);
        auVar26 = vpaddb_avx512vl(auVar19,auVar18);
        auVar18 = vpand_avx2(auVar32,auVar46);
        auVar19 = vpand_avx2(auVar47,auVar46);
        auVar27 = vpaddb_avx512vl(auVar19,auVar18);
        auVar18 = vpandq_avx512vl(auVar38,auVar46);
        auVar19 = vpandq_avx512vl(auVar42,auVar46);
        auVar28 = vpaddb_avx512vl(auVar19,auVar18);
        auVar18 = vpandq_avx512vl(auVar20,auVar46);
        auVar19 = vpandq_avx512vl(auVar55,auVar46);
        auVar29 = vpaddb_avx512vl(auVar19,auVar18);
        auVar18 = vpandq_avx512vl(auVar39,auVar46);
        auVar19 = vpandq_avx512vl(auVar21,auVar46);
        auVar30 = vpaddb_avx512vl(auVar19,auVar18);
        auVar18 = vpandq_avx512vl(auVar22,auVar46);
        auVar19 = vpandq_avx512vl(auVar23,auVar46);
        auVar31 = vpaddb_avx512vl(auVar19,auVar18);
        auVar18 = vpaddb_avx2(auVar44,auVar49);
        auVar19 = vpsrlw_avx2(auVar53,1);
        auVar53 = vpsrlw_avx2(auVar45,1);
        auVar19 = vpand_avx2(auVar19,auVar46);
        auVar53 = vpand_avx2(auVar53,auVar46);
        auVar19 = vpaddb_avx2(auVar53,auVar19);
        auVar53 = vpsrlw_avx2(auVar54,1);
        auVar45 = vpsrlw_avx2(auVar34,1);
        auVar53 = vpand_avx2(auVar53,auVar46);
        auVar45 = vpand_avx2(auVar45,auVar46);
        auVar54 = vpand_avx2(auVar19,auVar50);
        auVar34 = vpsrlw_avx2(auVar19,2);
        auVar19 = vpaddb_avx2(auVar45,auVar53);
        auVar53 = vpsrlw_avx2(auVar32,1);
        auVar45 = vpsrlw_avx2(auVar47,1);
        auVar32 = vpsrlw_avx512vl(auVar25,2);
        auVar34 = vpand_avx2(auVar34,auVar50);
        auVar49 = vpsrlw_avx512vl(auVar27,2);
        auVar53 = vpand_avx2(auVar53,auVar46);
        auVar45 = vpand_avx2(auVar45,auVar46);
        auVar47 = vpand_avx2(auVar32,auVar50);
        auVar44 = vpand_avx2(auVar49,auVar50);
        auVar53 = vpaddb_avx2(auVar45,auVar53);
        auVar45 = vpsrlw_avx512vl(auVar38,1);
        auVar32 = vpsrlw_avx512vl(auVar42,1);
        auVar38 = vpsrlw_avx512vl(auVar29,2);
        auVar45 = vpand_avx2(auVar45,auVar46);
        auVar32 = vpand_avx2(auVar32,auVar46);
        auVar49 = vpand_avx2(auVar53,auVar50);
        auVar33 = vpandq_avx512vl(auVar38,auVar50);
        auVar42 = vpaddb_avx512vl(auVar32,auVar45);
        auVar45 = vpsrlw_avx512vl(auVar20,1);
        auVar32 = vpsrlw_avx512vl(auVar55,1);
        auVar45 = vpand_avx2(auVar45,auVar46);
        auVar32 = vpand_avx2(auVar32,auVar46);
        auVar38 = vpaddb_avx512vl(auVar32,auVar45);
        auVar45 = vpsrlw_avx512vl(auVar39,1);
        auVar32 = vpsrlw_avx512vl(auVar21,1);
        auVar45 = vpand_avx2(auVar45,auVar46);
        auVar32 = vpand_avx2(auVar32,auVar46);
        auVar20 = vpandq_avx512vl(auVar38,auVar50);
        auVar55 = vpaddb_avx512vl(auVar32,auVar45);
        auVar45 = vpsrlw_avx512vl(auVar22,1);
        auVar32 = vpsrlw_avx512vl(auVar23,1);
        auVar45 = vpand_avx2(auVar45,auVar46);
        auVar32 = vpand_avx2(auVar32,auVar46);
        auVar39 = vpaddb_avx512vl(auVar32,auVar45);
        auVar45 = vpandq_avx512vl(auVar24,auVar50);
        auVar32 = vpandq_avx512vl(auVar25,auVar50);
        auVar21 = vpaddb_avx512vl(auVar32,auVar45);
        auVar45 = vpandq_avx512vl(auVar26,auVar50);
        auVar32 = vpandq_avx512vl(auVar27,auVar50);
        auVar22 = vpandq_avx512vl(auVar39,auVar50);
        auVar23 = vpaddb_avx512vl(auVar32,auVar45);
        auVar72 = auVar23._0_16_;
        auVar45 = vpandq_avx512vl(auVar28,auVar50);
        auVar32 = vpandq_avx512vl(auVar29,auVar50);
        auVar25 = vpaddb_avx512vl(auVar32,auVar45);
        auVar70 = auVar25._0_16_;
        auVar45 = vpandq_avx512vl(auVar30,auVar50);
        auVar32 = vpandq_avx512vl(auVar31,auVar50);
        auVar45 = vpaddb_avx2(auVar32,auVar45);
        auVar32 = vpand_avx2(auVar18,auVar50);
        auVar27 = vpsrlw_avx2(auVar18,2);
        auVar18 = vpaddb_avx2(auVar54,auVar32);
        auVar54 = vpand_avx2(auVar19,auVar50);
        auVar32 = vpand_avx2(auVar27,auVar50);
        auVar54 = vpaddb_avx2(auVar49,auVar54);
        auVar49 = vpandq_avx512vl(auVar42,auVar50);
        auVar34 = vpaddb_avx2(auVar34,auVar32);
        auVar32 = vpsrlw_avx2(auVar19,2);
        auVar29 = vpsrlw_avx2(auVar53,2);
        auVar53 = vpsrlw_avx512vl(auVar38,2);
        auVar27 = vpandq_avx512vl(auVar23,auVar51);
        auVar19 = vpaddb_avx2(auVar20,auVar49);
        auVar20 = vpandq_avx512vl(auVar55,auVar50);
        auVar32 = vpand_avx2(auVar32,auVar50);
        auVar49 = vpand_avx2(auVar29,auVar50);
        auVar38 = vpand_avx2(auVar53,auVar50);
        auVar53 = vpaddb_avx2(auVar22,auVar20);
        auVar20 = vpsrlw_avx512vl(auVar24,2);
        auVar32 = vpaddb_avx2(auVar49,auVar32);
        auVar42 = vpsrlw_avx512vl(auVar42,2);
        auVar39 = vpsrlw_avx512vl(auVar39,2);
        auVar22 = vpsrlw_avx512vl(auVar31,2);
        auVar24 = vmovdqa64_avx512vl(in_ZMM20._0_32_);
        auVar49 = vpand_avx2(auVar20,auVar50);
        auVar42 = vpand_avx2(auVar42,auVar50);
        auVar20 = vpandq_avx512vl(auVar39,auVar50);
        auVar39 = vpandq_avx512vl(auVar22,auVar50);
        auVar47 = vpaddb_avx2(auVar47,auVar49);
        auVar22 = vpsrlw_avx512vl(auVar26,2);
        auVar49 = vpaddb_avx2(auVar38,auVar42);
        auVar42 = vpsrlw_avx512vl(auVar55,2);
        auVar55 = vmovdqa64_avx512vl(in_ZMM19._0_32_);
        auVar38 = vpand_avx2(auVar22,auVar50);
        auVar42 = vpand_avx2(auVar42,auVar50);
        auVar44 = vpaddb_avx2(auVar44,auVar38);
        auVar38 = vpsrlw_avx512vl(auVar28,2);
        auVar42 = vpaddb_avx512vl(auVar20,auVar42);
        auVar20 = vpandq_avx512vl(auVar21,auVar51);
        auVar38 = vpand_avx2(auVar38,auVar50);
        auVar22 = vpaddb_avx512vl(auVar33,auVar38);
        auVar38 = vpsrlw_avx512vl(auVar30,2);
        auVar38 = vpandq_avx512vl(auVar38,auVar50);
        auVar39 = vpaddb_avx512vl(auVar39,auVar38);
        auVar20 = vpaddb_avx512vl(auVar27,auVar20);
        auVar38 = vpandq_avx512vl(auVar45,auVar51);
        auVar26 = vpandq_avx512vl(auVar25,auVar51);
        auVar45 = vpsrlw_avx2(auVar45,4);
        auVar26 = vpaddb_avx512vl(auVar38,auVar26);
        auVar27 = vpandq_avx512vl(auVar18,auVar51);
        auVar28 = vpandq_avx512vl(auVar54,auVar51);
        auVar18 = vpsrlw_avx2(auVar18,4);
        auVar54 = vpsrlw_avx2(auVar54,4);
        auVar38 = vpand_avx2(auVar45,auVar51);
        auVar18 = vpand_avx2(auVar18,auVar51);
        auVar45 = vpand_avx2(auVar54,auVar51);
        auVar27 = vpaddb_avx512vl(auVar28,auVar27);
        auVar54 = vpandq_avx512vl(auVar19,auVar51);
        auVar19 = vpsrlw_avx2(auVar19,4);
        auVar28 = vpandq_avx512vl(auVar53,auVar51);
        auVar18 = vpaddb_avx2(auVar45,auVar18);
        auVar53 = vpsrlw_avx2(auVar53,4);
        auVar19 = vpand_avx2(auVar19,auVar51);
        auVar45 = vpsrlw_avx2(auVar44,4);
        auVar28 = vpaddb_avx512vl(auVar28,auVar54);
        auVar54 = vpandq_avx512vl(auVar44,auVar51);
        auVar44 = vpandq_avx512vl(auVar47,auVar51);
        auVar29 = vpandq_avx512vl(auVar26,auVar43);
        auVar53 = vpand_avx2(auVar53,auVar51);
        auVar45 = vpand_avx2(auVar45,auVar51);
        auVar44 = vpaddb_avx512vl(auVar54,auVar44);
        auVar54 = vpandq_avx512vl(auVar22,auVar51);
        auVar30 = vpandq_avx512vl(auVar39,auVar51);
        auVar19 = vpaddb_avx2(auVar53,auVar19);
        auVar53 = vpsrlw_avx2(auVar47,4);
        auVar47 = vpsrlw_avx512vl(auVar39,4);
        auVar39 = vpaddb_avx512vl(auVar30,auVar54);
        auVar30 = vpandq_avx512vl(auVar34,auVar51);
        auVar34 = vpsrlw_avx2(auVar34,4);
        auVar31 = vpandq_avx512vl(auVar32,auVar51);
        auVar33 = vmovdqa64_avx512vl(in_ZMM16._0_32_);
        auVar53 = vpand_avx2(auVar53,auVar51);
        auVar54 = vpand_avx2(auVar47,auVar51);
        auVar34 = vpand_avx2(auVar34,auVar51);
        auVar30 = vpaddb_avx512vl(auVar31,auVar30);
        auVar47 = vpandq_avx512vl(auVar49,auVar51);
        auVar31 = vpandq_avx512vl(auVar42,auVar51);
        auVar53 = vpaddb_avx2(auVar45,auVar53);
        auVar45 = vpsrlw_avx2(auVar22,4);
        auVar22 = vpaddb_avx512vl(auVar31,auVar47);
        auVar68 = auVar22._0_16_;
        auVar47 = vpsrlw_avx512vl(auVar21,4);
        auVar21 = vpsrlw_avx512vl(auVar23,4);
        auVar45 = vpand_avx2(auVar45,auVar51);
        auVar47 = vpandq_avx512vl(auVar47,auVar51);
        auVar21 = vpandq_avx512vl(auVar21,auVar51);
        auVar45 = vpaddb_avx2(auVar54,auVar45);
        auVar54 = vpsrlw_avx2(auVar32,4);
        auVar32 = vpsrlw_avx2(auVar42,4);
        auVar42 = vpaddb_avx512vl(auVar21,auVar47);
        auVar47 = vpsrlw_avx512vl(auVar25,4);
        auVar21 = vmovdqa64_avx512vl(in_ZMM18._0_32_);
        auVar54 = vpand_avx2(auVar54,auVar51);
        auVar32 = vpand_avx2(auVar32,auVar51);
        auVar47 = vpandq_avx512vl(auVar47,auVar51);
        auVar54 = vpaddb_avx2(auVar54,auVar34);
        auVar34 = vpsrlw_avx2(auVar49,4);
        auVar49 = vpaddb_avx512vl(auVar38,auVar47);
        auVar38 = vmovdqa64_avx512vl(in_ZMM17._0_32_);
        auVar34 = vpand_avx2(auVar34,auVar51);
        auVar34 = vpaddb_avx2(auVar32,auVar34);
        auVar32 = vpandq_avx512vl(auVar20,auVar43);
        auVar32 = vpaddb_avx2(auVar29,auVar32);
        auVar47 = vpandq_avx512vl(auVar28,auVar43);
        local_280._0_32_ = vpaddw_avx2(auVar59._0_32_,auVar32);
        auVar59 = ZEXT3264(local_280._0_32_);
        auVar32 = vpandq_avx512vl(auVar27,auVar43);
        auVar32 = vpaddb_avx2(auVar47,auVar32);
        auVar47 = vpandq_avx512vl(auVar39,auVar43);
        unique0x00114b80 = vpaddw_avx2(auVar60._0_32_,auVar32);
        auVar60 = ZEXT3264(unique0x00114b80);
        auVar32 = vpandq_avx512vl(auVar44,auVar43);
        auVar32 = vpaddb_avx2(auVar47,auVar32);
        auVar47 = vpandq_avx512vl(auVar22,auVar43);
        local_240._0_32_ = vpaddw_avx2(auVar61._0_32_,auVar32);
        auVar61 = ZEXT3264(local_240._0_32_);
        auVar32 = vpandq_avx512vl(auVar30,auVar43);
        auVar32 = vpaddb_avx2(auVar47,auVar32);
        auVar47 = vpand_avx2(auVar49,auVar43);
        auVar29 = vpsrlw_avx2(auVar49,8);
        auVar49 = vpaddw_avx512vl(auVar33,auVar32);
        in_ZMM16 = ZEXT3264(auVar49);
        auVar17 = auVar49._0_16_;
        auVar32 = vpandq_avx512vl(auVar42,auVar43);
        auVar32 = vpaddb_avx2(auVar47,auVar32);
        auVar47 = vpand_avx2(auVar19,auVar43);
        auVar38 = vpaddw_avx512vl(auVar38,auVar32);
        in_ZMM17 = ZEXT3264(auVar38);
        auVar62 = auVar38._0_16_;
        auVar32 = vpand_avx2(auVar18,auVar43);
        auVar25 = vpsrlw_avx2(auVar18,8);
        auVar18 = vpaddb_avx2(auVar47,auVar32);
        auVar32 = vpand_avx2(auVar45,auVar43);
        auVar47 = vpaddw_avx512vl(auVar21,auVar18);
        in_ZMM18 = ZEXT3264(auVar47);
        auVar64 = auVar47._0_16_;
        auVar18 = vpand_avx2(auVar53,auVar43);
        auVar18 = vpaddb_avx2(auVar32,auVar18);
        auVar32 = vpand_avx2(auVar34,auVar43);
        auVar55 = vpaddw_avx512vl(auVar55,auVar18);
        in_ZMM19 = ZEXT3264(auVar55);
        auVar66 = auVar55._0_16_;
        auVar18 = vpand_avx2(auVar54,auVar43);
        auVar18 = vpaddb_avx2(auVar32,auVar18);
        auVar32 = vpsrlw_avx512vl(auVar26,8);
        auVar21 = vmovdqa64_avx512vl(in_ZMM22._0_32_);
        auVar23 = vpaddw_avx512vl(auVar24,auVar18);
        in_ZMM20 = ZEXT3264(auVar23);
        auVar18 = vpsrlw_avx512vl(auVar20,8);
        auVar20 = vmovdqa64_avx512vl(in_ZMM21._0_32_);
        auVar18 = vpaddb_avx2(auVar32,auVar18);
        auVar32 = vpsrlw_avx512vl(auVar28,8);
        auVar20 = vpaddw_avx512vl(auVar20,auVar18);
        in_ZMM21 = ZEXT3264(auVar20);
        auVar18 = vpsrlw_avx512vl(auVar27,8);
        auVar24 = vmovdqa64_avx512vl(in_ZMM23._0_32_);
        auVar18 = vpaddb_avx2(auVar32,auVar18);
        auVar32 = vpsrlw_avx512vl(auVar39,8);
        auVar39 = vpaddw_avx512vl(auVar21,auVar18);
        in_ZMM22 = ZEXT3264(auVar39);
        auVar18 = vpsrlw_avx512vl(auVar44,8);
        auVar18 = vpaddb_avx2(auVar32,auVar18);
        auVar32 = vpsrlw_avx512vl(auVar22,8);
        auVar44 = vpaddw_avx512vl(auVar24,auVar18);
        in_ZMM23 = ZEXT3264(auVar44);
        auVar18 = vpsrlw_avx512vl(auVar30,8);
        auVar18 = vpaddb_avx2(auVar32,auVar18);
        local_140._32_32_ = vpaddw_avx2(auVar58._0_32_,auVar18);
        auVar58 = ZEXT3264(local_140._32_32_);
        auVar18 = vpsrlw_avx512vl(auVar42,8);
        auVar18 = vpaddb_avx2(auVar18,auVar29);
        local_100._0_32_ = vpaddw_avx2(auVar57._0_32_,auVar18);
        auVar57 = ZEXT3264(local_100._0_32_);
        auVar18 = vpsrlw_avx2(auVar19,8);
        auVar18 = vpaddb_avx2(auVar18,auVar25);
        auVar19 = vpsrlw_avx2(auVar45,8);
        local_100._32_32_ = vpaddw_avx2(auVar48._0_32_,auVar18);
        auVar48 = ZEXT3264(local_100._32_32_);
        auVar18 = vpsrlw_avx2(auVar53,8);
        auVar18 = vpaddb_avx2(auVar19,auVar18);
        auVar19 = vpsrlw_avx2(auVar34,8);
        local_c0._0_32_ = vpaddw_avx2(auVar56._0_32_,auVar18);
        auVar56 = ZEXT3264(local_c0._0_32_);
        auVar18 = vpsrlw_avx2(auVar54,8);
        auVar18 = vpaddb_avx2(auVar19,auVar18);
        auVar18 = vpaddw_avx2(local_460,auVar18);
        local_460._0_8_ = auVar18._0_8_;
        local_460._8_8_ = auVar18._8_8_;
        local_460._16_8_ = auVar18._16_8_;
        local_460._24_8_ = auVar18._24_8_;
      } while (lVar16 != 0x200000);
      local_240._32_32_ = vmovdqa64_avx512vl(auVar49);
      local_200._0_32_ = vmovdqa64_avx512vl(auVar38);
      local_200._32_32_ = vmovdqa64_avx512vl(auVar47);
      local_1c0._0_32_ = vmovdqa64_avx512vl(auVar55);
      local_1c0._32_32_ = vmovdqa64_avx512vl(auVar23);
      local_180._0_32_ = vmovdqa64_avx512vl(auVar20);
      local_180._32_32_ = vmovdqa64_avx512vl(auVar39);
      local_140._0_32_ = vmovdqa64_avx512vl(auVar44);
      lVar16 = 0;
      local_c0._32_8_ = local_460._0_8_;
      local_c0._40_8_ = local_460._8_8_;
      local_c0._48_8_ = local_460._16_8_;
      local_c0._56_8_ = local_460._24_8_;
      do {
        auVar48 = vpmovzxwd_avx512f(*(undefined1 (*) [32])(local_280 + lVar16 * 8));
        auVar48 = vpaddd_avx512f(ZEXT464(*(uint *)((long)flags + lVar16)),auVar48);
        auVar18 = vextracti64x4_avx512f(auVar48,1);
        auVar48 = vpaddd_avx512f(auVar48,ZEXT3264(auVar18));
        auVar10 = vpaddd_avx(auVar48._0_16_,auVar48._16_16_);
        auVar11 = vpshufd_avx(auVar10,0xee);
        auVar10 = vpaddd_avx(auVar10,auVar11);
        auVar11 = vpshufd_avx(auVar10,0x55);
        auVar10 = vpaddd_avx(auVar10,auVar11);
        *(int *)((long)flags + lVar16) = auVar10._0_4_;
        lVar16 = lVar16 + 4;
      } while (lVar16 != 0x40);
      auVar48 = ZEXT1664((undefined1  [16])0x0);
      uVar14 = uVar14 + 1;
      puVar15 = puVar15 + 0x100000;
      local_c0 = vmovdqa64_avx512f(auVar48);
      local_100 = vmovdqa64_avx512f(auVar48);
      local_140 = vmovdqa64_avx512f(auVar48);
      local_180 = vmovdqa64_avx512f(auVar48);
      local_1c0 = vmovdqa64_avx512f(auVar48);
      local_200 = vmovdqa64_avx512f(auVar48);
      local_240 = vmovdqa64_avx512f(auVar48);
      _local_280 = vmovdqa64_avx512f(auVar48);
    } while (uVar14 != len >> 0x14);
    uVar14 = (ulong)((len >> 0x14) << 0xc);
  }
  lVar16 = uVar13 - uVar14;
  if (uVar13 < uVar14 || lVar16 == 0) {
    uVar13 = (uint)uVar14;
  }
  else {
    auVar18[8] = 0x55;
    auVar18._0_8_ = 0x5555555555555555;
    auVar18[9] = 0x55;
    auVar18[10] = 0x55;
    auVar18[0xb] = 0x55;
    auVar18[0xc] = 0x55;
    auVar18[0xd] = 0x55;
    auVar18[0xe] = 0x55;
    auVar18[0xf] = 0x55;
    auVar18[0x10] = 0x55;
    auVar18[0x11] = 0x55;
    auVar18[0x12] = 0x55;
    auVar18[0x13] = 0x55;
    auVar18[0x14] = 0x55;
    auVar18[0x15] = 0x55;
    auVar18[0x16] = 0x55;
    auVar18[0x17] = 0x55;
    auVar18[0x18] = 0x55;
    auVar18[0x19] = 0x55;
    auVar18[0x1a] = 0x55;
    auVar18[0x1b] = 0x55;
    auVar18[0x1c] = 0x55;
    auVar18[0x1d] = 0x55;
    auVar18[0x1e] = 0x55;
    auVar18[0x1f] = 0x55;
    auVar19[8] = 0x33;
    auVar19._0_8_ = 0x3333333333333333;
    auVar19[9] = 0x33;
    auVar19[10] = 0x33;
    auVar19[0xb] = 0x33;
    auVar19[0xc] = 0x33;
    auVar19[0xd] = 0x33;
    auVar19[0xe] = 0x33;
    auVar19[0xf] = 0x33;
    auVar19[0x10] = 0x33;
    auVar19[0x11] = 0x33;
    auVar19[0x12] = 0x33;
    auVar19[0x13] = 0x33;
    auVar19[0x14] = 0x33;
    auVar19[0x15] = 0x33;
    auVar19[0x16] = 0x33;
    auVar19[0x17] = 0x33;
    auVar19[0x18] = 0x33;
    auVar19[0x19] = 0x33;
    auVar19[0x1a] = 0x33;
    auVar19[0x1b] = 0x33;
    auVar19[0x1c] = 0x33;
    auVar19[0x1d] = 0x33;
    auVar19[0x1e] = 0x33;
    auVar19[0x1f] = 0x33;
    auVar53[8] = 7;
    auVar53._0_8_ = 0x707070707070707;
    auVar53[9] = 7;
    auVar53[10] = 7;
    auVar53[0xb] = 7;
    auVar53[0xc] = 7;
    auVar53[0xd] = 7;
    auVar53[0xe] = 7;
    auVar53[0xf] = 7;
    auVar53[0x10] = 7;
    auVar53[0x11] = 7;
    auVar53[0x12] = 7;
    auVar53[0x13] = 7;
    auVar53[0x14] = 7;
    auVar53[0x15] = 7;
    auVar53[0x16] = 7;
    auVar53[0x17] = 7;
    auVar53[0x18] = 7;
    auVar53[0x19] = 7;
    auVar53[0x1a] = 7;
    auVar53[0x1b] = 7;
    auVar53[0x1c] = 7;
    auVar53[0x1d] = 7;
    auVar53[0x1e] = 7;
    auVar53[0x1f] = 7;
    local_460._0_8_ = 0;
    local_460._8_8_ = 0;
    local_460._16_8_ = 0;
    local_460._24_8_ = 0;
    auVar48 = ZEXT1664((undefined1  [16])0x0);
    auVar56 = ZEXT1664((undefined1  [16])0x0);
    auVar57 = ZEXT1664((undefined1  [16])0x0);
    auVar58 = ZEXT1664((undefined1  [16])0x0);
    auVar59 = ZEXT1664((undefined1  [16])0x0);
    auVar60 = ZEXT1664((undefined1  [16])0x0);
    auVar17 = vpxord_avx512vl(auVar17,auVar17);
    auVar61 = ZEXT1664(auVar17);
    auVar17 = vpxord_avx512vl(auVar62,auVar62);
    auVar63 = ZEXT1664(auVar17);
    auVar17 = vpxord_avx512vl(auVar64,auVar64);
    auVar65 = ZEXT1664(auVar17);
    auVar17 = vpxord_avx512vl(auVar66,auVar66);
    auVar67 = ZEXT1664(auVar17);
    auVar17 = vpxord_avx512vl(auVar68,auVar68);
    auVar69 = ZEXT1664(auVar17);
    auVar17 = vpxord_avx512vl(auVar70,auVar70);
    auVar71 = ZEXT1664(auVar17);
    auVar17 = vpxord_avx512vl(auVar72,auVar72);
    auVar73 = ZEXT1664(auVar17);
    pauVar12 = (undefined1 (*) [32])(array + uVar14 * 0x100 + 0xf0);
    local_420 = ZEXT1632(ZEXT816(0));
    local_440 = ZEXT1632(ZEXT816(0));
    do {
      pauVar1 = pauVar12 + -0xf;
      pauVar2 = pauVar12 + -0xe;
      pauVar3 = pauVar12 + -0xd;
      pauVar4 = pauVar12 + -0xc;
      pauVar5 = pauVar12 + -0xb;
      pauVar6 = pauVar12 + -10;
      pauVar7 = pauVar12 + -9;
      pauVar8 = pauVar12 + -8;
      auVar46 = vmovdqa64_avx512vl(auVar61._0_32_);
      pauVar9 = pauVar12 + -7;
      auVar20 = vmovdqu64_avx512vl(pauVar12[-6]);
      auVar50 = vmovdqa64_avx512vl(auVar65._0_32_);
      auVar51 = vmovdqa64_avx512vl(auVar63._0_32_);
      auVar21 = vmovdqu64_avx512vl(pauVar12[-5]);
      auVar22 = vmovdqu64_avx512vl(pauVar12[-4]);
      auVar43 = vmovdqa64_avx512vl(auVar69._0_32_);
      auVar23 = vmovdqu64_avx512vl(pauVar12[-3]);
      auVar24 = vmovdqu64_avx512vl(pauVar12[-2]);
      auVar45 = vmovdqa64_avx512vl(auVar73._0_32_);
      auVar54 = vmovdqa64_avx512vl(auVar71._0_32_);
      auVar25 = vmovdqu64_avx512vl(pauVar12[-1]);
      auVar26 = vmovdqu64_avx512vl(*pauVar12);
      auVar27 = vmovdqa64_avx512vl(auVar67._0_32_);
      pauVar12 = pauVar12 + 0x10;
      lVar16 = lVar16 + -1;
      auVar34 = vpand_avx2(*pauVar1,auVar18);
      auVar32 = vpand_avx2(*pauVar2,auVar18);
      auVar47 = vpsrlw_avx2(*pauVar1,1);
      auVar49 = vpsrlw_avx2(*pauVar2,1);
      auVar28 = vpaddb_avx512vl(auVar32,auVar34);
      auVar34 = vpand_avx2(*pauVar3,auVar18);
      auVar32 = vpand_avx2(*pauVar4,auVar18);
      auVar47 = vpand_avx2(auVar47,auVar18);
      auVar49 = vpand_avx2(auVar49,auVar18);
      auVar29 = vpaddb_avx512vl(auVar32,auVar34);
      auVar34 = vpand_avx2(*pauVar5,auVar18);
      auVar32 = vpand_avx2(*pauVar6,auVar18);
      auVar30 = vpaddb_avx512vl(auVar32,auVar34);
      auVar34 = vpand_avx2(*pauVar7,auVar18);
      auVar32 = vpand_avx2(*pauVar8,auVar18);
      auVar31 = vpaddb_avx512vl(auVar32,auVar34);
      auVar34 = vpand_avx2(*pauVar9,auVar18);
      auVar32 = vpandq_avx512vl(auVar20,auVar18);
      auVar33 = vpaddb_avx512vl(auVar32,auVar34);
      auVar34 = vpandq_avx512vl(auVar21,auVar18);
      auVar32 = vpandq_avx512vl(auVar22,auVar18);
      auVar35 = vpaddb_avx512vl(auVar32,auVar34);
      auVar34 = vpandq_avx512vl(auVar23,auVar18);
      auVar32 = vpandq_avx512vl(auVar24,auVar18);
      auVar36 = vpaddb_avx512vl(auVar32,auVar34);
      auVar34 = vpandq_avx512vl(auVar25,auVar18);
      auVar32 = vpandq_avx512vl(auVar26,auVar18);
      auVar37 = vpaddb_avx512vl(auVar32,auVar34);
      auVar34 = vpaddb_avx2(auVar49,auVar47);
      auVar32 = vpsrlw_avx2(*pauVar3,1);
      auVar47 = vpsrlw_avx2(*pauVar4,1);
      auVar32 = vpand_avx2(auVar32,auVar18);
      auVar47 = vpand_avx2(auVar47,auVar18);
      auVar32 = vpaddb_avx2(auVar47,auVar32);
      auVar49 = vpsrlw_avx2(*pauVar6,1);
      auVar47 = vpsrlw_avx2(*pauVar5,1);
      auVar38 = vpsrlw_avx512vl(auVar29,2);
      auVar47 = vpand_avx2(auVar47,auVar18);
      auVar49 = vpand_avx2(auVar49,auVar18);
      auVar44 = vpand_avx2(auVar32,auVar19);
      auVar55 = vpsrlw_avx2(auVar32,2);
      auVar42 = vpand_avx2(auVar38,auVar19);
      auVar32 = vpaddb_avx2(auVar49,auVar47);
      auVar47 = vpsrlw_avx2(*pauVar7,1);
      auVar49 = vpsrlw_avx2(*pauVar8,1);
      auVar38 = vpand_avx2(auVar55,auVar19);
      auVar55 = vpsrlw_avx512vl(auVar31,2);
      auVar47 = vpand_avx2(auVar47,auVar18);
      auVar49 = vpand_avx2(auVar49,auVar18);
      auVar55 = vpand_avx2(auVar55,auVar19);
      auVar47 = vpaddb_avx2(auVar49,auVar47);
      auVar49 = vpsrlw_avx2(*pauVar9,1);
      auVar20 = vpsrlw_avx512vl(auVar20,1);
      auVar39 = vpsrlw_avx512vl(auVar35,2);
      auVar49 = vpand_avx2(auVar49,auVar18);
      auVar20 = vpand_avx2(auVar20,auVar18);
      auVar39 = vpand_avx2(auVar39,auVar19);
      auVar40 = vpaddb_avx512vl(auVar20,auVar49);
      auVar49 = vpsrlw_avx512vl(auVar21,1);
      auVar20 = vpsrlw_avx512vl(auVar22,1);
      auVar49 = vpand_avx2(auVar49,auVar18);
      auVar20 = vpand_avx2(auVar20,auVar18);
      auVar21 = vpaddb_avx512vl(auVar20,auVar49);
      auVar49 = vpsrlw_avx512vl(auVar23,1);
      auVar20 = vpsrlw_avx512vl(auVar24,1);
      auVar49 = vpand_avx2(auVar49,auVar18);
      auVar20 = vpand_avx2(auVar20,auVar18);
      auVar22 = vpandq_avx512vl(auVar21,auVar19);
      auVar23 = vpaddb_avx512vl(auVar20,auVar49);
      auVar49 = vpsrlw_avx512vl(auVar25,1);
      auVar20 = vpsrlw_avx512vl(auVar26,1);
      auVar49 = vpand_avx2(auVar49,auVar18);
      auVar20 = vpand_avx2(auVar20,auVar18);
      auVar24 = vpaddb_avx512vl(auVar20,auVar49);
      auVar49 = vpandq_avx512vl(auVar28,auVar19);
      auVar20 = vpandq_avx512vl(auVar29,auVar19);
      auVar25 = vpaddb_avx512vl(auVar20,auVar49);
      auVar49 = vpandq_avx512vl(auVar30,auVar19);
      auVar20 = vpandq_avx512vl(auVar31,auVar19);
      auVar26 = vpandq_avx512vl(auVar24,auVar19);
      auVar29 = vpaddb_avx512vl(auVar20,auVar49);
      auVar49 = vpandq_avx512vl(auVar33,auVar19);
      auVar20 = vpandq_avx512vl(auVar35,auVar19);
      auVar31 = vpaddb_avx512vl(auVar20,auVar49);
      auVar49 = vpandq_avx512vl(auVar36,auVar19);
      auVar20 = vpandq_avx512vl(auVar37,auVar19);
      auVar49 = vpaddb_avx2(auVar20,auVar49);
      auVar20 = vpand_avx2(auVar34,auVar19);
      auVar52 = vpsrlw_avx2(auVar34,2);
      auVar35 = vpaddb_avx512vl(auVar44,auVar20);
      auVar34 = vpand_avx2(auVar32,auVar19);
      auVar44 = vpand_avx2(auVar47,auVar19);
      auVar20 = vpand_avx2(auVar52,auVar19);
      auVar34 = vpaddb_avx2(auVar44,auVar34);
      auVar52 = vpandq_avx512vl(auVar40,auVar19);
      auVar44 = vpaddb_avx2(auVar38,auVar20);
      auVar38 = vpsrlw_avx2(auVar32,2);
      auVar20 = vpsrlw_avx2(auVar47,2);
      auVar47 = vpsrlw_avx512vl(auVar21,2);
      auVar41 = vpandq_avx512vl(auVar29,auVar53);
      auVar32 = vpaddb_avx2(auVar22,auVar52);
      auVar22 = vpandq_avx512vl(auVar23,auVar19);
      auVar38 = vpand_avx2(auVar38,auVar19);
      auVar20 = vpand_avx2(auVar20,auVar19);
      auVar21 = vpand_avx2(auVar47,auVar19);
      auVar47 = vpaddb_avx2(auVar26,auVar22);
      auVar22 = vpsrlw_avx512vl(auVar28,2);
      auVar38 = vpaddb_avx2(auVar20,auVar38);
      auVar26 = vpsrlw_avx512vl(auVar40,2);
      auVar24 = vpsrlw_avx512vl(auVar24,2);
      auVar28 = vpsrlw_avx512vl(auVar37,2);
      auVar27 = vmovdqa64_avx512vl(auVar27);
      auVar40._8_2_ = 0xf;
      auVar40._0_8_ = 0xf000f000f000f;
      auVar40._10_2_ = 0xf;
      auVar40._12_2_ = 0xf;
      auVar40._14_2_ = 0xf;
      auVar40._16_2_ = 0xf;
      auVar40._18_2_ = 0xf;
      auVar40._20_2_ = 0xf;
      auVar40._22_2_ = 0xf;
      auVar40._24_2_ = 0xf;
      auVar40._26_2_ = 0xf;
      auVar40._28_2_ = 0xf;
      auVar40._30_2_ = 0xf;
      auVar20 = vpand_avx2(auVar22,auVar19);
      auVar22 = vpand_avx2(auVar26,auVar19);
      auVar24 = vpandq_avx512vl(auVar24,auVar19);
      auVar26 = vpandq_avx512vl(auVar28,auVar19);
      auVar42 = vpaddb_avx2(auVar42,auVar20);
      auVar28 = vpsrlw_avx512vl(auVar30,2);
      auVar20 = vpaddb_avx2(auVar21,auVar22);
      auVar21 = vpsrlw_avx512vl(auVar23,2);
      auVar22 = vmovdqa64_avx512vl(auVar50);
      auVar50 = vpand_avx2(auVar28,auVar19);
      auVar21 = vpand_avx2(auVar21,auVar19);
      auVar50 = vpaddb_avx2(auVar55,auVar50);
      auVar55 = vpsrlw_avx512vl(auVar33,2);
      auVar21 = vpaddb_avx512vl(auVar24,auVar21);
      auVar23 = vpandq_avx512vl(auVar25,auVar53);
      auVar55 = vpand_avx2(auVar55,auVar19);
      auVar55 = vpaddb_avx2(auVar39,auVar55);
      auVar39 = vpsrlw_avx512vl(auVar36,2);
      auVar39 = vpand_avx2(auVar39,auVar19);
      auVar39 = vpaddb_avx512vl(auVar26,auVar39);
      auVar23 = vpaddb_avx512vl(auVar41,auVar23);
      auVar24 = vpandq_avx512vl(auVar49,auVar53);
      auVar26 = vpandq_avx512vl(auVar31,auVar53);
      auVar49 = vpsrlw_avx2(auVar49,4);
      auVar24 = vpaddb_avx512vl(auVar24,auVar26);
      auVar26 = vpandq_avx512vl(auVar34,auVar53);
      auVar28 = vpandq_avx512vl(auVar35,auVar53);
      auVar49 = vpand_avx2(auVar53,auVar49);
      auVar33 = vpsrlw_avx2(auVar34,4);
      auVar26 = vpaddb_avx512vl(auVar26,auVar28);
      auVar28 = vpandq_avx512vl(auVar32,auVar53);
      auVar30 = vpandq_avx512vl(auVar47,auVar53);
      auVar34 = vpsrlw_avx2(auVar32,4);
      auVar32 = vpsrlw_avx2(auVar47,4);
      auVar47 = vpand_avx2(auVar53,auVar33);
      auVar34 = vpand_avx2(auVar53,auVar34);
      auVar32 = vpand_avx2(auVar53,auVar32);
      auVar28 = vpaddb_avx512vl(auVar30,auVar28);
      auVar30 = vpandq_avx512vl(auVar42,auVar53);
      auVar33 = vpandq_avx512vl(auVar50,auVar53);
      auVar34 = vpaddb_avx2(auVar32,auVar34);
      auVar32 = vpsrlw_avx2(auVar42,4);
      auVar36 = vpsrlw_avx2(auVar50,4);
      auVar30 = vpaddb_avx512vl(auVar33,auVar30);
      auVar42 = vpandq_avx512vl(auVar55,auVar53);
      auVar33 = vpandq_avx512vl(auVar39,auVar53);
      auVar37 = vpsrlw_avx2(auVar39,4);
      auVar50 = vpand_avx2(auVar53,auVar32);
      auVar32 = vpand_avx2(auVar53,auVar36);
      auVar39 = vpaddb_avx512vl(auVar33,auVar42);
      auVar42 = vpandq_avx512vl(auVar44,auVar53);
      auVar33 = vpandq_avx512vl(auVar38,auVar53);
      auVar36 = vpsrlw_avx2(auVar44,4);
      auVar38 = vpsrlw_avx2(auVar38,4);
      auVar44 = vpand_avx2(auVar37,auVar53);
      auVar50 = vpaddb_avx2(auVar32,auVar50);
      auVar37 = vpsrlw_avx2(auVar55,4);
      auVar32 = vpand_avx2(auVar53,auVar36);
      auVar38 = vpand_avx2(auVar38,auVar53);
      auVar55 = vpaddb_avx512vl(auVar33,auVar42);
      auVar33 = vpandq_avx512vl(auVar20,auVar53);
      auVar36 = vpandq_avx512vl(auVar21,auVar53);
      auVar42 = vpand_avx2(auVar53,auVar37);
      auVar32 = vpaddb_avx2(auVar38,auVar32);
      auVar37 = vpsrlw_avx2(auVar20,4);
      auVar20 = vpandq_avx512vl(auVar24,auVar40);
      auVar33 = vpaddb_avx512vl(auVar36,auVar33);
      auVar38 = vpsrlw_avx512vl(auVar29,4);
      auVar25 = vpsrlw_avx512vl(auVar25,4);
      auVar29 = vmovdqa64_avx512vl(auVar54);
      auVar54 = vpaddb_avx2(auVar44,auVar42);
      auVar36 = vpsrlw_avx2(auVar21,4);
      auVar44 = vpand_avx2(auVar37,auVar53);
      auVar42 = vpandq_avx512vl(auVar25,auVar53);
      auVar21 = vpandq_avx512vl(auVar38,auVar53);
      auVar38 = vpand_avx2(auVar36,auVar53);
      auVar42 = vpaddb_avx512vl(auVar21,auVar42);
      auVar21 = vpsrlw_avx512vl(auVar31,4);
      auVar25 = vmovdqa64_avx512vl(auVar43);
      auVar31 = vmovdqa64_avx512vl(auVar51);
      auVar51 = vpaddb_avx2(auVar38,auVar44);
      auVar43 = vpandq_avx512vl(auVar23,auVar40);
      auVar44 = vpandq_avx512vl(auVar21,auVar53);
      auVar43 = vpaddb_avx2(auVar20,auVar43);
      auVar49 = vpaddb_avx512vl(auVar49,auVar44);
      auVar44 = vpsrlw_avx512vl(auVar35,4);
      auVar45 = vmovdqa64_avx512vl(auVar45);
      auVar44 = vpandq_avx512vl(auVar44,auVar53);
      auVar47 = vpaddb_avx512vl(auVar47,auVar44);
      auVar44 = vmovdqa64_avx512vl(auVar46);
      local_440 = vpaddw_avx2(local_440,auVar43);
      auVar46 = vpandq_avx512vl(auVar26,auVar40);
      auVar43 = vpandq_avx512vl(auVar28,auVar40);
      auVar46 = vpaddb_avx2(auVar43,auVar46);
      local_420 = vpaddw_avx2(local_420,auVar46);
      auVar46 = vpandq_avx512vl(auVar30,auVar40);
      auVar43 = vpandq_avx512vl(auVar39,auVar40);
      auVar46 = vpaddb_avx2(auVar43,auVar46);
      auVar43 = vpandq_avx512vl(auVar33,auVar40);
      auVar45 = vpaddw_avx512vl(auVar45,auVar46);
      auVar73 = ZEXT3264(auVar45);
      auVar46 = vpandq_avx512vl(auVar55,auVar40);
      auVar46 = vpaddb_avx2(auVar43,auVar46);
      auVar43 = vpand_avx2(auVar40,auVar49);
      auVar35 = vpsrlw_avx2(auVar49,8);
      auVar49 = vpaddw_avx512vl(auVar29,auVar46);
      auVar71 = ZEXT3264(auVar49);
      auVar46 = vpandq_avx512vl(auVar42,auVar40);
      auVar46 = vpaddb_avx2(auVar43,auVar46);
      auVar43 = vpand_avx2(auVar40,auVar34);
      auVar29 = vpsrlw_avx2(auVar34,8);
      auVar34 = vpaddw_avx512vl(auVar25,auVar46);
      auVar69 = ZEXT3264(auVar34);
      auVar46 = vpand_avx2(auVar40,auVar47);
      auVar46 = vpaddb_avx2(auVar43,auVar46);
      auVar43 = vpand_avx2(auVar40,auVar54);
      auVar38 = vpaddw_avx512vl(auVar27,auVar46);
      auVar67 = ZEXT3264(auVar38);
      auVar46 = vpand_avx2(auVar40,auVar50);
      auVar46 = vpaddb_avx2(auVar43,auVar46);
      auVar43 = vpand_avx2(auVar51,auVar40);
      auVar20 = vpaddw_avx512vl(auVar22,auVar46);
      auVar65 = ZEXT3264(auVar20);
      auVar46 = vpand_avx2(auVar40,auVar32);
      auVar46 = vpaddb_avx2(auVar43,auVar46);
      auVar43 = vpsrlw_avx512vl(auVar24,8);
      auVar21 = vpaddw_avx512vl(auVar31,auVar46);
      auVar63 = ZEXT3264(auVar21);
      auVar46 = vpsrlw_avx512vl(auVar23,8);
      auVar46 = vpaddb_avx2(auVar43,auVar46);
      auVar43 = vpsrlw_avx512vl(auVar28,8);
      auVar44 = vpaddw_avx512vl(auVar44,auVar46);
      auVar61 = ZEXT3264(auVar44);
      auVar46 = vpsrlw_avx512vl(auVar26,8);
      auVar46 = vpaddb_avx2(auVar43,auVar46);
      auVar43 = vpsrlw_avx512vl(auVar39,8);
      local_180._32_32_ = vpaddw_avx2(auVar60._0_32_,auVar46);
      auVar60 = ZEXT3264(local_180._32_32_);
      auVar46 = vpsrlw_avx512vl(auVar30,8);
      auVar46 = vpaddb_avx2(auVar43,auVar46);
      auVar43 = vpsrlw_avx512vl(auVar33,8);
      local_140._0_32_ = vpaddw_avx2(auVar59._0_32_,auVar46);
      auVar59 = ZEXT3264(local_140._0_32_);
      auVar46 = vpsrlw_avx512vl(auVar55,8);
      auVar46 = vpaddb_avx2(auVar43,auVar46);
      local_140._32_32_ = vpaddw_avx2(auVar58._0_32_,auVar46);
      auVar58 = ZEXT3264(local_140._32_32_);
      auVar46 = vpsrlw_avx512vl(auVar42,8);
      auVar46 = vpaddb_avx2(auVar46,auVar35);
      local_100._0_32_ = vpaddw_avx2(auVar57._0_32_,auVar46);
      auVar57 = ZEXT3264(local_100._0_32_);
      auVar46 = vpsrlw_avx2(auVar47,8);
      auVar46 = vpaddb_avx2(auVar29,auVar46);
      auVar43 = vpsrlw_avx2(auVar54,8);
      local_100._32_32_ = vpaddw_avx2(auVar56._0_32_,auVar46);
      auVar56 = ZEXT3264(local_100._32_32_);
      auVar46 = vpsrlw_avx2(auVar50,8);
      auVar46 = vpaddb_avx2(auVar43,auVar46);
      auVar50 = vpsrlw_avx2(auVar51,8);
      local_c0._0_32_ = vpaddw_avx2(auVar48._0_32_,auVar46);
      auVar48 = ZEXT3264(local_c0._0_32_);
      auVar46 = vpsrlw_avx2(auVar32,8);
      auVar46 = vpaddb_avx2(auVar50,auVar46);
      auVar46 = vpaddw_avx2(local_460,auVar46);
      local_460._0_8_ = auVar46._0_8_;
      local_460._8_8_ = auVar46._8_8_;
      local_460._16_8_ = auVar46._16_8_;
      local_460._24_8_ = auVar46._24_8_;
    } while (lVar16 != 0);
    local_280._32_8_ = local_420._0_8_;
    local_280._0_32_ = local_440;
    uStack_258 = local_420._8_8_;
    uStack_250 = local_420._16_8_;
    uStack_248 = local_420._24_8_;
    local_240._0_32_ = vmovdqa64_avx512vl(auVar45);
    local_240._32_32_ = vmovdqa64_avx512vl(auVar49);
    local_200._0_32_ = vmovdqa64_avx512vl(auVar34);
    local_200._32_32_ = vmovdqa64_avx512vl(auVar38);
    local_1c0._0_32_ = vmovdqa64_avx512vl(auVar20);
    local_1c0._32_32_ = vmovdqa64_avx512vl(auVar21);
    local_180._0_32_ = vmovdqa64_avx512vl(auVar44);
    local_c0._32_8_ = local_460._0_8_;
    local_c0._40_8_ = local_460._8_8_;
    local_c0._48_8_ = local_460._16_8_;
    local_c0._56_8_ = local_460._24_8_;
  }
  uVar14 = (ulong)(uVar13 << 8);
  if (uVar14 < len) {
    auVar48 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar56 = vpmovsxbd_avx512f(_DAT_0011f080);
    auVar57 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      uVar14 = uVar14 + 1;
      auVar58 = vpbroadcastd_avx512f();
      auVar58 = vpsrlvd_avx512f(auVar58,auVar56);
      auVar58 = vpandd_avx512f(auVar58,auVar57);
      auVar48 = vpaddd_avx512f(auVar58,auVar48);
    } while (len != uVar14);
    auVar48 = vmovdqu64_avx512f(auVar48);
    *(undefined1 (*) [64])flags = auVar48;
  }
  lVar16 = 0;
  do {
    auVar48 = vpmovzxwd_avx512f(*(undefined1 (*) [32])(local_280 + lVar16 * 8));
    auVar48 = vpaddd_avx512f(ZEXT464(*(uint *)((long)flags + lVar16)),auVar48);
    auVar46 = vextracti64x4_avx512f(auVar48,1);
    auVar48 = vpaddd_avx512f(auVar48,ZEXT3264(auVar46));
    auVar17 = vpaddd_avx(auVar48._0_16_,auVar48._16_16_);
    auVar62 = vpshufd_avx(auVar17,0xee);
    auVar17 = vpaddd_avx(auVar17,auVar62);
    auVar62 = vpshufd_avx(auVar17,0x55);
    auVar17 = vpaddd_avx(auVar17,auVar62);
    *(int *)((long)flags + lVar16) = auVar17._0_4_;
    lVar16 = lVar16 + 4;
  } while (lVar16 != 0x40);
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_adder_forest(const uint16_t* array, uint32_t len, uint32_t* flags) {
    __m256i counters[16];

    for (size_t i = 0; i < 16; ++i) {
        counters[i] = _mm256_setzero_si256();
    }

    const __m256i mask1bit = _mm256_set1_epi16(0x5555); // 0101010101010101
    const __m256i mask2bit = _mm256_set1_epi16(0x3333); // 0011001100110011
    const __m256i mask4bit = _mm256_set1_epi16(0x0F0F); // 1111000011110000
    const __m256i mask8bit = _mm256_set1_epi16(0x00FF); // 0000000011111111
    
    const uint32_t n_cycles = len / (4096 * (16*16));
    const uint32_t n_total  = len / (16*16);
    uint16_t tmp[16];

/*------ Macros --------*/
#define LL(i,p,k)  const __m256i sum##p##k##_##i##bit_even = _mm256_add_epi8(input##p & mask##i##bit, input##k & mask##i##bit);
#define LO(i,p,k)  const __m256i sum##p##k##_##i##bit_odd  = _mm256_add_epi8(_mm256_srli_epi16(input##p, i) & mask##i##bit, _mm256_srli_epi16(input##k, i) & mask##i##bit);

#define LBLOCK(i)                                 \
    LL(i,0,1) LL(i,2,3)   LL(i,4,5)   LL(i,6,7)   \
    LL(i,8,9) LL(i,10,11) LL(i,12,13) LL(i,14,15) \
    LO(i,0,1) LO(i,2,3)   LO(i,4,5)   LO(i,6,7)   \
    LO(i,8,9) LO(i,10,11) LO(i,12,13) LO(i,14,15)

#define EVEN(b,i,k,p) input##i = sum##k##p##_##b##bit_even;
#define ODD(b,i,k,p)  input##i = sum##k##p##_##b##bit_odd;

#define UPDATE(i)                                                  \
    EVEN(i,0,0,1) EVEN(i,1,2,3)   EVEN(i,2,4,5)   EVEN(i,3,6,7)    \
    EVEN(i,4,8,9) EVEN(i,5,10,11) EVEN(i,6,12,13) EVEN(i,7,14,15)  \
     ODD(i,8,0,1)  ODD(i,9,2,3)    ODD(i,10,4,5)   ODD(i,11,6,7)   \
     ODD(i,12,8,9) ODD(i,13,10,11) ODD(i,14,12,13) ODD(i,15,14,15) \

#define UE(i,p,k) counters[i] = _mm256_add_epi16(counters[i], sum##p##k##_8bit_even);
#define UO(i,p,k) counters[i] = _mm256_add_epi16(counters[i], sum##p##k##_8bit_odd);

/*------ Start --------*/
#define L(p) __m256i input##p = _mm256_loadu_si256((__m256i*)(array + i*4096*256 + j*256 + p*16));
    size_t i = 0;
    for (/**/; i < n_cycles; ++i) {
        for (int j = 0; j < 4096; ++j) {
            // Load 16 registers.
            L(0)  L(1)  L(2)  L(3)  
            L(4)  L(5)  L(6)  L(7) 
            L(8)  L(9)  L(10) L(11) 
            L(12) L(13) L(14) L(15)

            // Perform updates for bits {1,2,4,8}.
            LBLOCK(1) UPDATE(1)
            LBLOCK(2) UPDATE(2)
            LBLOCK(4) UPDATE(4)
            LBLOCK(8) UPDATE(8)

            // Update accumulators.
            UE( 0,0,1) UE( 1, 2, 3) UE( 2, 4, 5) UE( 3, 6, 7)  
            UE( 4,8,9) UE( 5,10,11) UE( 6,12,13) UE( 7,14,15) 
            UO( 8,0,1) UO( 9, 2, 3) UO(10, 4, 5) UO(11, 6, 7) 
            UO(12,8,9) UO(13,10,11) UO(14,12,13) UO(15,14,15)
        }

        // Update.
        for (size_t i = 0; i < 16; ++i) {
            _mm256_storeu_si256((__m256i*)tmp, counters[i]);
            for (int j = 0; j < 16; ++j)
                flags[i] += tmp[j];
        }
        // Reset.
        for (size_t i = 0; i < 16; ++i) {
            counters[i] = _mm256_setzero_si256();
        }
    }
#undef L
#define L(p) __m256i input##p = _mm256_loadu_si256((__m256i*)(array + i*256 + p*16));
    i *= 4096;
    for (/**/; i < n_total; ++i) {
        // Load 16 registers.
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 
        L(8)  L(9)  L(10) L(11) 
        L(12) L(13) L(14) L(15)

        // Perform updates for bits {1,2,4,8}.
        LBLOCK(1) UPDATE(1)
        LBLOCK(2) UPDATE(2)
        LBLOCK(4) UPDATE(4)
        LBLOCK(8) UPDATE(8)

        // Update accumulators.
        UE( 0,0,1) UE( 1, 2, 3) UE( 2, 4, 5) UE( 3, 6, 7)  
        UE( 4,8,9) UE( 5,10,11) UE( 6,12,13) UE( 7,14,15) 
        UO( 8,0,1) UO( 9, 2, 3) UO(10, 4, 5) UO(11, 6, 7) 
        UO(12,8,9) UO(13,10,11) UO(14,12,13) UO(15,14,15)
    }

    i *= 256;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef UPDATE
#undef ODD
#undef EVEN
#undef LBLOCK
#undef LL
#undef LO
#undef UO
#undef UE

    for (size_t i = 0; i < 16; ++i) {
        _mm256_storeu_si256((__m256i*)tmp, counters[i]);
        for (int j = 0; j < 16; ++j)
            flags[i] += tmp[j];
    }
    return 0;
}